

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPileCollider.cpp
# Opt level: O0

Position __thiscall
solitaire::colliders::TableauPileCollider::getCardPosition(TableauPileCollider *this,uint index)

{
  Position PVar1;
  Position local_28;
  uint local_20;
  uint local_1c;
  uint topCoveredCardPosition;
  uint index_local;
  TableauPileCollider *this_local;
  
  local_1c = index;
  _topCoveredCardPosition = this;
  throwIfInvalidIndex(this,index);
  local_20 = (*(this->tableauPile->super_Archiver)._vptr_Archiver[8])();
  local_28 = getRelativeCardPosition(this,local_1c,local_20);
  PVar1 = geometry::operator+(&this->position,&local_28);
  return PVar1;
}

Assistant:

Position TableauPileCollider::getCardPosition(const unsigned index) const {
    throwIfInvalidIndex(index);
    const auto topCoveredCardPosition = tableauPile.getTopCoveredCardPosition();
    return position + getRelativeCardPosition(index, topCoveredCardPosition);
}